

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructReader * __thiscall
capnp::_::OrphanBuilder::asStructReader
          (StructReader *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  uint uVar4;
  uint uVar5;
  CapTableReader *pCVar6;
  Arena *pAVar7;
  ReadLimiter *pRVar8;
  word *pwVar9;
  size_t sVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar13;
  SegmentBuilder *pSVar14;
  undefined4 in_register_00000014;
  ulong uVar15;
  OrphanBuilder *pOVar16;
  ulong uVar17;
  ulong uVar18;
  SegmentBuilder **ppSVar19;
  SegmentBuilder *pSVar12;
  undefined4 extraout_var_00;
  
  uVar4 = (uint)(this->tag).content;
  uVar5 = *(uint *)((long)&(this->tag).content + 4);
  if (uVar5 == 0 && uVar4 == 0) goto LAB_001cde31;
  pSVar12 = this->segment;
  pCVar6 = &this->capTable->super_CapTableReader;
  if ((uVar4 & 3) == 2 && pSVar12 != (SegmentBuilder *)0x0) {
    pAVar7 = (pSVar12->super_SegmentReader).arena;
    iVar11 = (*pAVar7->_vptr_Arena[2])(pAVar7,(ulong)uVar5,CONCAT44(in_register_00000014,size));
    pSVar12 = (SegmentBuilder *)CONCAT44(extraout_var,iVar11);
    if (pSVar12 == (SegmentBuilder *)0x0) {
      asStructReader();
      ppSVar19 = (SegmentBuilder **)0x0;
    }
    else {
      uVar4 = (uint)(this->tag).content;
      uVar15 = (ulong)(uVar4 >> 3);
      uVar18 = (pSVar12->super_SegmentReader).ptr.size_;
      if ((long)uVar18 < (long)uVar15) {
        uVar15 = uVar18;
      }
      uVar17 = 2 - (ulong)((uVar4 & 4) == 0);
      if (uVar17 + uVar15 <= uVar18) {
        pOVar16 = (OrphanBuilder *)((pSVar12->super_SegmentReader).ptr.ptr + uVar15);
        pRVar8 = (pSVar12->super_SegmentReader).readLimiter;
        uVar18 = pRVar8->limit;
        if (uVar17 <= uVar18) {
          pRVar8->limit = uVar18 - uVar17;
          ppSVar1 = &pOVar16->segment;
          if (((this->tag).content & 4) == 0) {
            lVar13 = (long)((int)(pOVar16->tag).content >> 2);
            pwVar9 = (pSVar12->super_SegmentReader).ptr.ptr;
            ppSVar19 = (SegmentBuilder **)(pwVar9 + (pSVar12->super_SegmentReader).ptr.size_);
            this = pOVar16;
            if (((long)pwVar9 - (long)ppSVar1 >> 3 <= lVar13) &&
               (lVar13 <= (long)ppSVar19 - (long)ppSVar1 >> 3)) {
              ppSVar19 = ppSVar1 + lVar13;
            }
          }
          else {
            pAVar7 = (pSVar12->super_SegmentReader).arena;
            iVar11 = (*pAVar7->_vptr_Arena[2])
                               (pAVar7,(ulong)*(uint *)((long)&(pOVar16->tag).content + 4));
            pSVar14 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar11);
            this = (OrphanBuilder *)ppSVar1;
            if (pSVar14 == (SegmentBuilder *)0x0) {
              asStructReader();
            }
            else {
              uVar4 = (uint)(pOVar16->tag).content;
              if ((uVar4 & 3) == 2) {
                uVar18 = (ulong)(uVar4 >> 3);
                sVar10 = (pSVar14->super_SegmentReader).ptr.size_;
                if ((long)sVar10 < (long)uVar18) {
                  uVar18 = sVar10;
                }
                ppSVar19 = (SegmentBuilder **)((pSVar14->super_SegmentReader).ptr.ptr + uVar18);
                pSVar12 = pSVar14;
                goto LAB_001cdd8d;
              }
              asStructReader();
            }
            ppSVar19 = (SegmentBuilder **)0x0;
          }
          goto LAB_001cdd8d;
        }
        (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      asStructReader();
      ppSVar19 = (SegmentBuilder **)0x0;
    }
  }
  else {
    ppSVar19 = (SegmentBuilder **)this->location;
  }
LAB_001cdd8d:
  if (ppSVar19 != (SegmentBuilder **)0x0) {
    if (((this->tag).content & 3) == 0) {
      if (pSVar12 == (SegmentBuilder *)0x0) {
LAB_001cdde4:
        uVar2 = *(ushort *)((long)&(this->tag).content + 4);
        SVar3 = *(StructPointerCount *)((long)&(this->tag).content + 6);
        __return_storage_ptr__->segment = &pSVar12->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar6;
        __return_storage_ptr__->data = ppSVar19;
        __return_storage_ptr__->pointers = (WirePointer *)(ppSVar19 + uVar2);
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = SVar3;
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        return __return_storage_ptr__;
      }
      uVar18 = (ulong)*(ushort *)((long)&(this->tag).content + 4) +
               (ulong)*(ushort *)((long)&(this->tag).content + 6);
      if (((long)ppSVar19 - (long)(pSVar12->super_SegmentReader).ptr.ptr >> 3) + uVar18 <=
          (pSVar12->super_SegmentReader).ptr.size_) {
        pRVar8 = (pSVar12->super_SegmentReader).readLimiter;
        uVar15 = pRVar8->limit;
        if (uVar18 <= uVar15) {
          pRVar8->limit = uVar15 - uVar18;
          goto LAB_001cdde4;
        }
        (*((pSVar12->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      asStructReader();
    }
    else {
      asStructReader();
    }
  }
LAB_001cde31:
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->pointers = (WirePointer *)0x0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

StructReader OrphanBuilder::asStructReader(StructSize size) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readStructPointer(
      segment, capTable, tagAsPtr(), location, nullptr, kj::maxValue);
}